

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_bspline_eval
          (REF_INT degree,REF_INT n_control_point,REF_DBL *knots,REF_DBL t,REF_DBL *control_points,
          REF_DBL *val)

{
  REF_STATUS RVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  REF_INT span;
  REF_DBL N [16];
  
  *val = 0.0;
  if (degree < 0x10) {
    ref_geom_bspline_span_index(degree,n_control_point,knots,t,&span);
    RVar1 = ref_geom_bspline_basis(degree,knots,t,span,N);
    if (RVar1 == 0) {
      RVar1 = 0;
      for (lVar2 = 0; lVar2 <= degree; lVar2 = lVar2 + 1) {
        iVar4 = (span - degree) + (int)lVar2;
        if (iVar4 < 0) {
          pcVar5 = "point negative";
          uVar3 = 0x10ff;
          goto LAB_0015e52e;
        }
        if (n_control_point <= iVar4) {
          pcVar5 = "point >= n_control_point";
          uVar3 = 0x1100;
          goto LAB_0015e52e;
        }
        *val = N[lVar2] * control_points[(ulong)(uint)(span - degree) + lVar2] + *val;
      }
    }
    else {
      RVar1 = 1;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10fc
             ,"ref_geom_bspline_eval",1,"basis");
    }
  }
  else {
    pcVar5 = "temp variables sized smaller than degree";
    uVar3 = 0x10f9;
LAB_0015e52e:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar3,
           "ref_geom_bspline_eval",pcVar5);
    RVar1 = 1;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_eval(REF_INT degree,
                                         REF_INT n_control_point,
                                         REF_DBL *knots, REF_DBL t,
                                         REF_DBL *control_points,
                                         REF_DBL *val) {
  REF_INT span;
  REF_DBL N[16];
  REF_INT i, point;
  *val = 0.0;
  RAS(degree < 16, "temp variables sized smaller than degree");
  RSS(ref_geom_bspline_span_index(degree, n_control_point, knots, t, &span),
      "index");
  RSS(ref_geom_bspline_basis(degree, knots, t, span, N), "basis");
  for (i = 0; i < degree + 1; i++) {
    point = span - degree + i;
    RAS(point >= 0, "point negative");
    RAS(point < n_control_point, "point >= n_control_point");
    (*val) += N[i] * control_points[point];
  }
  return REF_SUCCESS;
}